

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

void __thiscall cmCTestGIT::CommitParser::DoHeaderLine(CommitParser *this)

{
  bool bVar1;
  string *this_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  Person author;
  string local_30;
  
  str._M_str = (this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p;
  str._M_len = (this->super_DiffParser).super_LineParser.Line._M_string_length;
  bVar1 = cmHasLiteralPrefix<8ul>(str,(char (*) [8])"commit ");
  if (bVar1) {
    std::__cxx11::string::substr
              ((ulong)&author,(ulong)&(this->super_DiffParser).super_LineParser.Line);
    std::__cxx11::string::operator=((string *)&this->Rev,(string *)&author);
    std::__cxx11::string::~string((string *)&author);
  }
  else {
    str_00._M_str = (this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p;
    str_00._M_len = (this->super_DiffParser).super_LineParser.Line._M_string_length;
    bVar1 = cmHasLiteralPrefix<8ul>(str_00,(char (*) [8])"author ");
    if (bVar1) {
      author.Name._M_dataplus._M_p = (pointer)&author.Name.field_2;
      author.Name._M_string_length = 0;
      author.Name.field_2._M_local_buf[0] = '\0';
      author.EMail._M_dataplus._M_p = (pointer)&author.EMail.field_2;
      author.EMail._M_string_length = 0;
      author.EMail.field_2._M_local_buf[0] = '\0';
      author.Time = 0;
      author.TimeZone = 0;
      ParsePerson(this,(this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p + 7,&author);
      std::__cxx11::string::_M_assign((string *)&(this->Rev).Author);
      std::__cxx11::string::_M_assign((string *)&(this->Rev).EMail);
      FormatDateTime_abi_cxx11_(&local_30,this,&author);
      this_00 = (string *)&(this->Rev).Date;
    }
    else {
      str_01._M_str = (this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p;
      str_01._M_len = (this->super_DiffParser).super_LineParser.Line._M_string_length;
      bVar1 = cmHasLiteralPrefix<11ul>(str_01,(char (*) [11])"committer ");
      if (!bVar1) {
        return;
      }
      author.Name._M_dataplus._M_p = (pointer)&author.Name.field_2;
      author.Name._M_string_length = 0;
      author.Name.field_2._M_local_buf[0] = '\0';
      author.EMail._M_dataplus._M_p = (pointer)&author.EMail.field_2;
      author.EMail._M_string_length = 0;
      author.EMail.field_2._M_local_buf[0] = '\0';
      author.Time = 0;
      author.TimeZone = 0;
      ParsePerson(this,(this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p + 10,&author)
      ;
      std::__cxx11::string::_M_assign((string *)&(this->Rev).Committer);
      std::__cxx11::string::_M_assign((string *)&(this->Rev).CommitterEMail);
      FormatDateTime_abi_cxx11_(&local_30,this,&author);
      this_00 = (string *)&(this->Rev).CommitDate;
    }
    std::__cxx11::string::operator=(this_00,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    Person::~Person(&author);
  }
  return;
}

Assistant:

void DoHeaderLine()
  {
    // Look for header fields that we need.
    if (cmHasLiteralPrefix(this->Line, "commit ")) {
      this->Rev.Rev = this->Line.substr(7);
    } else if (cmHasLiteralPrefix(this->Line, "author ")) {
      Person author;
      this->ParsePerson(this->Line.c_str() + 7, author);
      this->Rev.Author = author.Name;
      this->Rev.EMail = author.EMail;
      this->Rev.Date = this->FormatDateTime(author);
    } else if (cmHasLiteralPrefix(this->Line, "committer ")) {
      Person committer;
      this->ParsePerson(this->Line.c_str() + 10, committer);
      this->Rev.Committer = committer.Name;
      this->Rev.CommitterEMail = committer.EMail;
      this->Rev.CommitDate = this->FormatDateTime(committer);
    }
  }